

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O0

void CheckLine(cmMakefile *mf,string *prefix,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *variablesToRead,char *line)

{
  string_view value_00;
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  _Self local_b8;
  _Self local_b0 [3];
  allocator<char> local_91;
  string local_90;
  CacheEntryType local_6c;
  undefined1 local_68 [4];
  CacheEntryType type;
  string value;
  string var;
  char *line_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variablesToRead_local;
  string *prefix_local;
  cmMakefile *mf_local;
  
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  local_6c = UNINITIALIZED;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,line,&local_91);
  bVar1 = cmake::ParseCacheEntry
                    (&local_90,(string *)((long)&value.field_2 + 8),(string *)local_68,&local_6c);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if (bVar1) {
    local_b0[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(variablesToRead,(key_type *)((long)&value.field_2 + 8));
    local_b8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(variablesToRead);
    bVar1 = std::operator!=(local_b0,&local_b8);
    if (bVar1) {
      std::operator+(&local_d8,prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&value.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(value.field_2._M_local_buf + 8),(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        value_00 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
        cmMakefile::AddDefinition(mf,(string *)((long)&value.field_2 + 8),value_00);
      }
      else {
        cmMakefile::RemoveDefinition(mf,(string *)((long)&value.field_2 + 8));
      }
    }
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return;
}

Assistant:

static void CheckLine(cmMakefile& mf, std::string const& prefix,
                      std::set<std::string> const& variablesToRead,
                      const char* line)
{
  // Check one line of the cache file.
  std::string var;
  std::string value;
  cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
  if (cmake::ParseCacheEntry(line, var, value, type)) {
    // Found a real entry.  See if this one was requested.
    if (variablesToRead.find(var) != variablesToRead.end()) {
      // This was requested.  Set this variable locally with the given
      // prefix.
      var = prefix + var;
      if (!value.empty()) {
        mf.AddDefinition(var, value);
      } else {
        mf.RemoveDefinition(var);
      }
    }
  }
}